

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O2

void __thiscall nesvis::PpuWidget::draw_nametables(PpuWidget *this)

{
  bool bVar1;
  PpuRegisters *pPVar2;
  int __val;
  string tab_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  pPVar2 = n_e_s::nes::Nes::ppu_registers(this->nes_);
  __val = 0;
  ImGui::Text("%s: %i","Pattern table used: ",(ulong)((pPVar2->ctrl).value_ >> 4 & 1));
  bVar1 = ImGui::BeginTabBar("MyTabBar",0);
  if (bVar1) {
    for (; __val != 4; __val = __val + 1) {
      std::__cxx11::to_string(&local_48,__val);
      std::operator+(&local_68,"Nametable ",&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      bVar1 = ImGui::BeginTabItem(local_68._M_dataplus._M_p,(bool *)0x0,0);
      if (bVar1) {
        draw_nametable(this,(uint16_t)__val);
        ImGui::EndTabItem();
      }
      std::__cxx11::string::~string((string *)&local_68);
    }
    ImGui::EndTabBar();
  }
  return;
}

Assistant:

void PpuWidget::draw_nametables() {
    const auto reg = nes_->ppu_registers();
    const int pattern_table = reg.ctrl.is_set(4u) ? 1 : 0;
    ImGui::Text("%s: %i", "Pattern table used: ", pattern_table);

    if (ImGui::BeginTabBar("MyTabBar")) {
        for (auto nametable = 0; nametable < 4; ++nametable) {
            const std::string tab_name =
                    "Nametable " + std::to_string(nametable);
            if (ImGui::BeginTabItem(tab_name.c_str())) {
                draw_nametable(nametable);
                ImGui::EndTabItem();
            }
        }
        ImGui::EndTabBar();
    }
}